

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void create_decl(c2m_ctx_t c2m_ctx,node_t_conflict scope,node_t_conflict decl_node,
                decl_spec decl_spec,node_t_conflict initializer,int param_p)

{
  check_ctx *pcVar1;
  decl_spec dVar2;
  uint func_def_p_00;
  node_code_t nVar3;
  int iVar4;
  decl_t decl_00;
  node_t_conflict r;
  type *ptVar5;
  node_t_conflict pnVar6;
  pos_t pVar7;
  bool local_d9;
  bool local_b1;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  decl_t decl;
  type *type;
  node_t_conflict declarator;
  node_t_conflict list_head;
  node_t_conflict id;
  int func_p;
  int func_def_p;
  check_ctx_t check_ctx;
  int param_p_local;
  node_t_conflict initializer_local;
  node_t_conflict decl_node_local;
  node_t_conflict scope_local;
  c2m_ctx_t c2m_ctx_local;
  
  dVar2 = decl_spec;
  pcVar1 = c2m_ctx->check_ctx;
  func_def_p_00 = (uint)(decl_node->code == N_FUNC_DEF);
  id._0_4_ = 0;
  list_head = (node_t_conflict)0x0;
  decl_00 = (decl_t)reg_malloc(c2m_ctx,0x60);
  if (((decl_node->code != N_MEMBER) && (decl_node->code != N_SPEC_DECL)) &&
     (decl_node->code != N_FUNC_DEF)) {
    __assert_fail("decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL || decl_node->code == N_FUNC_DEF"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ec9,
                  "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
  }
  init_decl(c2m_ctx,decl_00);
  decl_00->scope = scope;
  *(undefined4 *)&(decl_00->decl_spec).field_0x0 = decl_spec._0_4_;
  (decl_00->decl_spec).align = decl_spec.align;
  decl_spec.align_node = dVar2.align_node;
  (decl_00->decl_spec).align_node = decl_spec.align_node;
  decl_spec._16_8_ = dVar2._16_8_;
  (decl_00->decl_spec).linkage = decl_spec.linkage;
  *(undefined4 *)&(decl_00->decl_spec).field_0x14 = decl_spec._20_4_;
  decl_spec.type = dVar2.type;
  (decl_00->decl_spec).type = decl_spec.type;
  decl_node->attr = decl_00;
  r = DLIST_node_t_el(&(decl_node->u).ops,1);
  if (r->code == N_IGNORE) {
    if (decl_node->code != N_MEMBER) {
      __assert_fail("decl_node->code == N_MEMBER",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed0,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    (decl_00->decl_spec).linkage = N_IGNORE;
  }
  else {
    if (r->code != N_DECL) {
      __assert_fail("declarator->code == N_DECL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1ed3,
                    "void create_decl(c2m_ctx_t, node_t, node_t, struct decl_spec, node_t, int)");
    }
    ptVar5 = check_declarator(c2m_ctx,r,func_def_p_00);
    ptVar5 = append_type(ptVar5,(decl_00->decl_spec).type);
    (decl_00->decl_spec).type = ptVar5;
  }
  check_type(c2m_ctx,(decl_00->decl_spec).type,0,func_def_p_00);
  if (r->code == N_DECL) {
    list_head = DLIST_node_t_head(&(r->u).ops);
    pnVar6 = DLIST_node_t_next(list_head);
    pnVar6 = DLIST_node_t_head(&(pnVar6->u).ops);
    local_b1 = false;
    if ((param_p == 0) && (local_b1 = false, pnVar6 != (node_t_conflict)0x0)) {
      local_b1 = pnVar6->code == N_FUNC;
    }
    id._0_4_ = (uint)local_b1;
    nVar3 = get_id_linkage(c2m_ctx,(uint)id,list_head,scope,decl_00->decl_spec);
    (decl_00->decl_spec).linkage = nVar3;
  }
  if (decl_node->code != N_MEMBER) {
    set_type_layout(c2m_ctx,(decl_00->decl_spec).type);
    check_decl_align(c2m_ctx,&decl_00->decl_spec);
    if ((((undefined1  [32])((undefined1  [32])decl_00->decl_spec & (undefined1  [32])0x1) ==
          (undefined1  [32])0x0) && (decl_00->scope != c2m_ctx->top_scope)) &&
       (decl_00->scope->code != N_FUNC)) {
      VARR_decl_tpush(pcVar1->func_decls_for_allocation,decl_00);
    }
  }
  if (r->code == N_DECL) {
    def_symbol(c2m_ctx,S_REGULAR,list_head,scope,decl_node,(decl_00->decl_spec).linkage);
    if ((scope != c2m_ctx->top_scope) && ((decl_00->decl_spec).linkage == N_EXTERN)) {
      def_symbol(c2m_ctx,S_REGULAR,list_head,c2m_ctx->top_scope,decl_node,N_EXTERN);
    }
    if (((uint)id != 0) && ((*(byte *)&decl_00->decl_spec >> 5 & 1) != 0)) {
      pVar7 = get_node_pos(c2m_ctx,list_head);
      local_78 = pVar7.fname;
      local_70 = pVar7._8_8_;
      error(c2m_ctx,0x1d6543,local_78,local_70);
      if (c2m_ctx->options->message_file != (FILE *)0x0) {
        if (list_head->code != N_IGNORE) {
          fprintf((FILE *)c2m_ctx->options->message_file," of %s",(list_head->u).s.s);
        }
        fprintf((FILE *)c2m_ctx->options->message_file,"\n");
      }
    }
  }
  if ((initializer != (node_t_conflict)0x0) && (initializer->code != N_IGNORE)) {
    iVar4 = incomplete_type_p(c2m_ctx,(decl_00->decl_spec).type);
    if ((iVar4 == 0) ||
       ((((decl_00->decl_spec).type)->mode == TM_ARR &&
        (iVar4 = incomplete_type_p(c2m_ctx,((((decl_00->decl_spec).type)->u).ptr_type)->arr_type),
        iVar4 == 0)))) {
      if (((decl_00->decl_spec).linkage == N_EXTERN) && (scope != c2m_ctx->top_scope)) {
        pVar7 = get_node_pos(c2m_ctx,initializer);
        local_a8 = pVar7.fname;
        local_a0 = pVar7._8_8_;
        error(c2m_ctx,0x1d65b7,local_a8,local_a0,(list_head->u).s.s);
      }
      else {
        check(c2m_ctx,initializer,decl_node);
        local_d9 = true;
        if ((((decl_00->decl_spec).linkage != N_STATIC) &&
            (local_d9 = true, (decl_00->decl_spec).linkage != N_EXTERN)) &&
           (local_d9 = true, (*(byte *)&decl_00->decl_spec >> 5 & 1) == 0)) {
          local_d9 = (*(byte *)&decl_00->decl_spec >> 2 & 1) != 0;
        }
        check_initializer(c2m_ctx,(decl_t)0x0,&(decl_00->decl_spec).type,initializer,(uint)local_d9,
                          1);
      }
    }
    else if ((((decl_00->decl_spec).type)->mode == TM_ARR) &&
            (((((decl_00->decl_spec).type)->u).ptr_type)->arr_type->mode == TM_ARR)) {
      pVar7 = get_node_pos(c2m_ctx,initializer);
      local_88 = pVar7.fname;
      local_80 = pVar7._8_8_;
      error(c2m_ctx,0x1d6565,local_88,local_80);
    }
    else {
      pVar7 = get_node_pos(c2m_ctx,initializer);
      local_98 = pVar7.fname;
      local_90 = pVar7._8_8_;
      error(c2m_ctx,0x1d658c,local_98,local_90);
    }
  }
  return;
}

Assistant:

static void create_decl (c2m_ctx_t c2m_ctx, node_t scope, node_t decl_node,
                         struct decl_spec decl_spec, node_t initializer, int param_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  int func_def_p = decl_node->code == N_FUNC_DEF, func_p = FALSE;
  node_t id = NULL; /* to remove an uninitialized warning */
  node_t list_head, declarator;
  struct type *type;
  decl_t decl = reg_malloc (c2m_ctx, sizeof (struct decl));

  assert (decl_node->code == N_MEMBER || decl_node->code == N_SPEC_DECL
          || decl_node->code == N_FUNC_DEF);
  init_decl (c2m_ctx, decl);
  decl->scope = scope;
  decl->decl_spec = decl_spec;
  decl_node->attr = decl;
  declarator = NL_EL (decl_node->u.ops, 1);
  if (declarator->code == N_IGNORE) {
    assert (decl_node->code == N_MEMBER);
    decl->decl_spec.linkage = N_IGNORE;
  } else {
    assert (declarator->code == N_DECL);
    type = check_declarator (c2m_ctx, declarator, func_def_p);
    decl->decl_spec.type = append_type (type, decl->decl_spec.type);
  }
  check_type (c2m_ctx, decl->decl_spec.type, 0, func_def_p);
  if (declarator->code == N_DECL) {
    id = NL_HEAD (declarator->u.ops);
    list_head = NL_HEAD (NL_NEXT (id)->u.ops);
    func_p = !param_p && list_head && list_head->code == N_FUNC;
    decl->decl_spec.linkage = get_id_linkage (c2m_ctx, func_p, id, scope, decl->decl_spec);
  }
  if (decl_node->code != N_MEMBER) {
    set_type_layout (c2m_ctx, decl->decl_spec.type);
    check_decl_align (c2m_ctx, &decl->decl_spec);
    if (!decl->decl_spec.typedef_p && decl->scope != top_scope && decl->scope->code != N_FUNC)
      VARR_PUSH (decl_t, func_decls_for_allocation, decl);
  }
  if (declarator->code == N_DECL) {
    def_symbol (c2m_ctx, S_REGULAR, id, scope, decl_node, decl->decl_spec.linkage);
    if (scope != top_scope && decl->decl_spec.linkage == N_EXTERN)
      def_symbol (c2m_ctx, S_REGULAR, id, top_scope, decl_node, N_EXTERN);
    if (func_p && decl->decl_spec.thread_local_p) {
      error (c2m_ctx, POS (id), "thread local function declaration");
      if (c2m_options->message_file != NULL) {
        if (id->code != N_IGNORE) fprintf (c2m_options->message_file, " of %s", id->u.s.s);
        fprintf (c2m_options->message_file, "\n");
      }
    }
  }
  if (initializer == NULL || initializer->code == N_IGNORE) return;
  if (incomplete_type_p (c2m_ctx, decl->decl_spec.type)
      && (decl->decl_spec.type->mode != TM_ARR
          || incomplete_type_p (c2m_ctx, decl->decl_spec.type->u.arr_type->el_type))) {
    if (decl->decl_spec.type->mode == TM_ARR
        && decl->decl_spec.type->u.arr_type->el_type->mode == TM_ARR)
      error (c2m_ctx, POS (initializer), "initialization of incomplete sub-array");
    else
      error (c2m_ctx, POS (initializer), "initialization of incomplete type variable");
    return;
  }
  if (decl->decl_spec.linkage == N_EXTERN && scope != top_scope) {
    error (c2m_ctx, POS (initializer), "initialization of %s in block scope with external linkage",
           id->u.s.s);
    return;
  }
  check (c2m_ctx, initializer, decl_node);
  check_initializer (c2m_ctx, NULL, &decl->decl_spec.type, initializer,
                     decl->decl_spec.linkage == N_STATIC || decl->decl_spec.linkage == N_EXTERN
                       || decl->decl_spec.thread_local_p || decl->decl_spec.static_p,
                     TRUE);
}